

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

void __thiscall
slang::ast::UnpackedUnionType::UnpackedUnionType
          (UnpackedUnionType *this,Compilation *compilation,bool isTagged,SourceLocation loc,
          ASTContext *context)

{
  SourceLocation loc_00;
  string_view name;
  byte bVar1;
  int iVar2;
  Symbol *in_RCX;
  byte in_DL;
  Compilation *in_RSI;
  char *in_RDI;
  Type *in_R8;
  SymbolIndex index;
  Compilation *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  SymbolKind in_stack_ffffffffffffffd4;
  undefined7 in_stack_ffffffffffffffe0;
  char *pcVar3;
  
  bVar1 = in_DL & 1;
  pcVar3 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8);
  name._M_str = pcVar3;
  name._M_len = (size_t)in_RSI;
  loc_00._7_1_ = bVar1;
  loc_00._0_7_ = in_stack_ffffffffffffffe0;
  Type::Type(in_R8,in_stack_ffffffffffffffd4,name,loc_00);
  Scope::Scope((Scope *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,in_RCX);
  index = (SymbolIndex)((ulong)in_RCX >> 0x20);
  std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)0x579de6);
  in_RDI[0x90] = '\0';
  in_RDI[0x91] = '\0';
  in_RDI[0x92] = '\0';
  in_RDI[0x93] = '\0';
  in_RDI[0x94] = '\0';
  in_RDI[0x95] = '\0';
  in_RDI[0x96] = '\0';
  in_RDI[0x97] = '\0';
  in_RDI[0x98] = '\0';
  in_RDI[0x99] = '\0';
  in_RDI[0x9a] = '\0';
  in_RDI[0x9b] = '\0';
  in_RDI[0x9c] = '\0';
  in_RDI[0x9d] = '\0';
  in_RDI[0x9e] = '\0';
  in_RDI[0x9f] = '\0';
  iVar2 = Compilation::getNextUnionSystemId(in_RSI);
  *(int *)(in_RDI + 0xa0) = iVar2;
  in_RDI[0xa4] = bVar1 & 1;
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x579e2d);
  Symbol::setParent((Symbol *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (Scope *)in_stack_ffffffffffffffc8,index);
  return;
}

Assistant:

UnpackedUnionType::UnpackedUnionType(Compilation& compilation, bool isTagged, SourceLocation loc,
                                     const ASTContext& context) :
    Type(SymbolKind::UnpackedUnionType, "", loc), Scope(compilation, this),
    systemId(compilation.getNextUnionSystemId()), isTagged(isTagged) {

    // Union types don't live as members of the parent scope (they're "owned" by
    // the declaration containing them) but we hook up the parent pointer so that
    // it can participate in name lookups.
    setParent(*context.scope, context.lookupIndex);
}